

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_classes.h
# Opt level: O0

t_class * class_new(char *name,method mnew,method mfree,long size,method mmenu,short type,...)

{
  t_mock_messlist *ptVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____)>_>_>
  *puVar2;
  t_symbol *ptVar3;
  mapped_type *pp_Var4;
  allocator<char> local_a1;
  key_type local_a0;
  allocator<char> local_69;
  key_type local_68;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____)>_>_>
  *local_48;
  t_mock_messlist *mock_messlist;
  t_class *c;
  method p_Stack_30;
  short type_local;
  method mmenu_local;
  long size_local;
  method mfree_local;
  method mnew_local;
  char *name_local;
  
  c._6_2_ = type;
  p_Stack_30 = mmenu;
  mmenu_local = (method)size;
  size_local = (long)mfree;
  mfree_local = mnew;
  mnew_local = (method)name;
  mock_messlist = (t_mock_messlist *)operator_new(0x98);
  puVar2 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,____)>_>_>
            *)operator_new(0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...)>_>_>
  ::unordered_map(puVar2);
  local_48 = puVar2;
  ptVar3 = gensym((char *)mnew_local);
  ptVar1 = mock_messlist;
  puVar2 = local_48;
  (mock_messlist->_M_h)._M_buckets = (__buckets_ptr)ptVar3;
  (mock_messlist->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)size_local;
  (mock_messlist->_M_h)._M_element_count = (size_type)mmenu_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"###CLASS###",&local_69);
  pp_Var4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...)>_>_>
            ::operator[](puVar2,&local_68);
  *pp_Var4 = (mapped_type)ptVar1;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  puVar2 = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"classname",&local_a1);
  pp_Var4 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*(*)(void_*,_...)>_>_>
            ::operator[](puVar2,&local_a0);
  *pp_Var4 = object_classname;
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  mock_messlist[1]._M_h._M_element_count = (size_type)local_48;
  return (t_class *)mock_messlist;
}

Assistant:

MOCK_EXPORT t_class* class_new(const char* name, const method mnew, const method mfree, long size, const method mmenu, short type, ...) {
    t_class			*c = new t_class;
    t_mock_messlist	*mock_messlist = new t_mock_messlist;

    c->c_sym = gensym(name);
    c->c_freefun = mfree;
    c->c_size = size;

    (*mock_messlist)["###CLASS###"] = (method)c;
    (*mock_messlist)["classname"] = (method)object_classname;
    c->c_messlist = (t_messlist*)mock_messlist;

    return c;
}